

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O2

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
basic_socket_acceptor<asio::io_context>
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          int param_3)

{
  error_code ec;
  error_code local_28;
  
  detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::open
            ((this->impl_).service_,(char *)&(this->impl_).implementation_,param_3,&local_28);
  detail::throw_error(&local_28,"open");
  return;
}

Assistant:

basic_socket_acceptor(ExecutionContext& context,
      const protocol_type& protocol,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value,
        defaulted_constraint
      > = defaulted_constraint())
    : impl_(0, 0, context)
  {
    asio::error_code ec;
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
  }